

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O2

float outgoing(xr_key *key0_prev,xr_key *key0,xr_key *key1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = 0.0;
  switch(key0->shape) {
  case '\0':
    fVar4 = 1.0 - key0->tension;
    uVar1 = key0->continuity;
    uVar2 = key0->bias;
    fVar3 = (1.0 - (float)uVar2) * (1.0 - (float)uVar1) * fVar4;
    fVar5 = key1->value - key0->value;
    if (key0_prev != (xr_key *)0x0) {
      return (fVar3 * fVar5 +
             (key0->value - key0_prev->value) * ((float)uVar2 + 1.0) * fVar4 * ((float)uVar1 + 1.0))
             * ((key1->time - key0->time) / (key1->time - key0_prev->time));
    }
    goto LAB_0018f0aa;
  case '\x01':
  case '\x02':
    fVar3 = key0->param[1];
    if (key0_prev != (xr_key *)0x0) {
      return fVar3 * ((key1->time - key0->time) / (key1->time - key0_prev->time));
    }
    break;
  case '\x03':
    fVar3 = key1->value - key0->value;
    if (key0_prev == (xr_key *)0x0) {
      return fVar3;
    }
    fVar5 = (key1->time - key0->time) / (key1->time - key0_prev->time);
    fVar3 = fVar3 + (key0->value - key0_prev->value);
LAB_0018f0aa:
    return fVar3 * fVar5;
  case '\x05':
    fVar3 = (key1->time - key0->time) * key0->param[3];
    if (1e-05 < ABS(key0->param[2])) {
      return fVar3 / key0->param[2];
    }
    fVar3 = fVar3 * 100000.0;
  }
  return fVar3;
}

Assistant:

static float outgoing(const xr_key* key0_prev, const xr_key* key0, const xr_key* key1)
{
	float a, b, d, t, out;
	switch (key0->shape) {
	case xr_key::SHAPE_TCB:
		a = (1.f - key0->tension)*(1.f + key0->continuity)*(1.f + key0->bias);
		b = (1.f - key0->tension)*(1.f - key0->continuity)*(1.f - key0->bias);
		d = key1->value - key0->value;
		if (key0_prev) {
			t = (key1->time - key0->time)/(key1->time - key0_prev->time);
			out = t*(a*(key0->value - key0_prev->value) + b*d);
		} else {
			out = b*d;
		}
		break;

	case xr_key::SHAPE_LINE:
		d = key1->value - key0->value;
		if (key0_prev) {
			t = (key1->time - key0->time)/(key1->time - key0_prev->time);
			out = t*(key0->value - key0_prev->value + d);
		} else {
			out = d;
		}
		break;

	case xr_key::SHAPE_BEZI:
	case xr_key::SHAPE_HERM:
		out = key0->param[1];
		if (key0_prev)
			out *= (key1->time - key0->time)/(key1->time - key0_prev->time);
		break;

	case xr_key::SHAPE_BEZ2:
		out = key0->param[3]*(key1->time - key0->time);
		if (std::abs(key0->param[2]) > 1e-5f)
			out /= key0->param[2];
		else
			out *= 1e+5f;
		break;

	case xr_key::SHAPE_STEP:
	default:
		out = 0.f;
		break;
	}
	return out;
}